

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O2

void __thiscall QueryResult::do_or(QueryResult *this,QueryResult *other,QueryCounter *counter)

{
  QueryOperation op;
  QueryOperation local_58;
  SortedRun local_48;
  
  local_58.parent = counter;
  local_58.start_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if ((this->has_everything == false) && (other->has_everything != true)) {
    SortedRun::do_or(&this->results,&other->results);
  }
  else {
    this->has_everything = true;
    local_48.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    SortedRun::operator=(&this->results,&local_48);
    SortedRun::~SortedRun(&local_48);
  }
  QueryOperation::~QueryOperation(&local_58);
  return;
}

Assistant:

void QueryResult::do_or(QueryResult &&other, QueryCounter *counter) {
    auto op = QueryOperation(counter);
    if (this->is_everything() || other.is_everything()) {
        has_everything = true;
        results = std::move(SortedRun());
    } else {
        results.do_or(other.results);
    }
}